

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

bool __thiscall
snappy::SnappyScatteredWriter<snappy::SnappySinkAllocator>::SlowAppend
          (SnappyScatteredWriter<snappy::SnappySinkAllocator> *this,char *ip,size_t len)

{
  pointer *pppcVar1;
  iterator __position;
  char *pcVar2;
  ulong uVar3;
  ulong __n;
  
  pcVar2 = this->op_ptr_;
  __n = (long)this->op_limit_ - (long)pcVar2;
  if (__n < len) {
    do {
      memcpy(this->op_ptr_,ip,__n);
      pcVar2 = this->op_ptr_ + __n;
      this->op_ptr_ = pcVar2;
      if (this->op_limit_ != pcVar2) {
        __assert_fail("op_limit_ - op_ptr_ == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/snappy/snappy.cc"
                      ,0x5df,
                      "bool snappy::SnappyScatteredWriter<snappy::SnappySinkAllocator>::SlowAppend(const char *, size_t) [Allocator = snappy::SnappySinkAllocator]"
                     );
      }
      pcVar2 = pcVar2 + (this->full_size_ - (long)this->op_base_);
      this->full_size_ = (size_t)pcVar2;
      len = len - __n;
      if ((char *)this->expected_ < pcVar2 + len) {
        return false;
      }
      uVar3 = (long)this->expected_ - (long)pcVar2;
      if (0xffff < uVar3) {
        uVar3 = 0x10000;
      }
      pcVar2 = SnappySinkAllocator::Allocate(&this->allocator_,(int)uVar3);
      this->op_base_ = pcVar2;
      this->op_ptr_ = pcVar2;
      this->op_limit_ = pcVar2 + uVar3;
      __position._M_current =
           (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
                  ((vector<char*,std::allocator<char*>> *)&this->blocks_,__position,&this->op_base_)
        ;
      }
      else {
        *__position._M_current = pcVar2;
        pppcVar1 = &(this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
      ip = ip + __n;
      __n = uVar3;
    } while (uVar3 < len);
    pcVar2 = this->op_ptr_;
  }
  memcpy(pcVar2,ip,len);
  this->op_ptr_ = this->op_ptr_ + len;
  return true;
}

Assistant:

bool SnappyScatteredWriter<Allocator>::SlowAppend(const char* ip, size_t len) {
  size_t avail = op_limit_ - op_ptr_;
  while (len > avail) {
    // Completely fill this block
    memcpy(op_ptr_, ip, avail);
    op_ptr_ += avail;
    assert(op_limit_ - op_ptr_ == 0);
    full_size_ += (op_ptr_ - op_base_);
    len -= avail;
    ip += avail;

    // Bounds check
    if (full_size_ + len > expected_) {
      return false;
    }

    // Make new block
    size_t bsize = std::min<size_t>(kBlockSize, expected_ - full_size_);
    op_base_ = allocator_.Allocate(bsize);
    op_ptr_ = op_base_;
    op_limit_ = op_base_ + bsize;
    blocks_.push_back(op_base_);
    avail = bsize;
  }

  memcpy(op_ptr_, ip, len);
  op_ptr_ += len;
  return true;
}